

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

char * ucnv_detectUnicodeSignature_63
                 (char *source,int32_t sourceLength,int32_t *signatureLength,UErrorCode *pErrorCode)

{
  UBool UVar1;
  size_t sVar2;
  int local_40;
  char cStack_39;
  int i;
  undefined1 auStack_34 [3];
  char start [5];
  int32_t dummy;
  UErrorCode *pErrorCode_local;
  int32_t *signatureLength_local;
  int32_t sourceLength_local;
  char *source_local;
  
  _cStack_39 = 0xa5a5a5a5;
  i._3_1_ = -0x5b;
  local_40 = 0;
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (unique0x1000011f = pErrorCode, UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    source_local = (char *)0x0;
  }
  else if ((source == (char *)0x0) || (sourceLength < -1)) {
    *stack0xffffffffffffffd0 = U_ILLEGAL_ARGUMENT_ERROR;
    source_local = (char *)0x0;
  }
  else {
    pErrorCode_local = signatureLength;
    if (signatureLength == (int32_t *)0x0) {
      pErrorCode_local = (UErrorCode *)auStack_34;
    }
    signatureLength_local._4_4_ = sourceLength;
    if (sourceLength == -1) {
      sVar2 = strlen(source);
      signatureLength_local._4_4_ = (int32_t)sVar2;
    }
    for (; local_40 < signatureLength_local._4_4_ && local_40 < 5; local_40 = local_40 + 1) {
      (&cStack_39)[local_40] = source[local_40];
    }
    if ((cStack_39 == -2) && ((char)i == -1)) {
      *pErrorCode_local = U_MISSING_RESOURCE_ERROR;
      source_local = "UTF-16BE";
    }
    else if ((cStack_39 == -1) && ((char)i == -2)) {
      if ((i._1_1_ == '\0') && (i._2_1_ == '\0')) {
        *pErrorCode_local = U_FILE_ACCESS_ERROR;
        source_local = "UTF-32LE";
      }
      else {
        *pErrorCode_local = U_MISSING_RESOURCE_ERROR;
        source_local = "UTF-16LE";
      }
    }
    else if (((cStack_39 == -0x11) && ((char)i == -0x45)) && (i._1_1_ == -0x41)) {
      *pErrorCode_local = U_INVALID_FORMAT_ERROR;
      source_local = "UTF-8";
    }
    else if ((((cStack_39 == '\0') && ((char)i == '\0')) && (i._1_1_ == -2)) && (i._2_1_ == -1)) {
      *pErrorCode_local = U_FILE_ACCESS_ERROR;
      source_local = "UTF-32BE";
    }
    else if (((cStack_39 == '\x0e') && ((char)i == -2)) && (i._1_1_ == -1)) {
      *pErrorCode_local = U_INVALID_FORMAT_ERROR;
      source_local = "SCSU";
    }
    else if (((cStack_39 == -5) && ((char)i == -0x12)) && (i._1_1_ == '(')) {
      *pErrorCode_local = U_INVALID_FORMAT_ERROR;
      source_local = "BOCU-1";
    }
    else {
      if (((cStack_39 == '+') && ((char)i == '/')) && (i._1_1_ == 'v')) {
        if ((i._2_1_ == '8') && (i._3_1_ == '-')) {
          *pErrorCode_local = U_INTERNAL_PROGRAM_ERROR;
          source_local = "UTF-7";
          return source_local;
        }
        if ((((i._2_1_ == '8') || (i._2_1_ == '9')) || (i._2_1_ == '+')) || (i._2_1_ == '/')) {
          *pErrorCode_local = U_FILE_ACCESS_ERROR;
          source_local = "UTF-7";
          return source_local;
        }
      }
      else if (((cStack_39 == -0x23) && ((char)i == 's')) && ((i._1_1_ == 'f' && (i._2_1_ == 's'))))
      {
        *pErrorCode_local = U_FILE_ACCESS_ERROR;
        source_local = "UTF-EBCDIC";
        return source_local;
      }
      *pErrorCode_local = U_ZERO_ERROR;
      source_local = (char *)0x0;
    }
  }
  return source_local;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_detectUnicodeSignature( const char* source,
                             int32_t sourceLength,
                             int32_t* signatureLength,
                             UErrorCode* pErrorCode) {
    int32_t dummy;

    /* initial 0xa5 bytes: make sure that if we read <SIG_MAX_LEN
     * bytes we don't misdetect something 
     */
    char start[SIG_MAX_LEN]={ '\xa5', '\xa5', '\xa5', '\xa5', '\xa5' };
    int i = 0;

    if((pErrorCode==NULL) || U_FAILURE(*pErrorCode)){
        return NULL;
    }
    
    if(source == NULL || sourceLength < -1){
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(signatureLength == NULL) {
        signatureLength = &dummy;
    }

    if(sourceLength==-1){
        sourceLength=(int32_t)uprv_strlen(source);
    }

    
    while(i<sourceLength&& i<SIG_MAX_LEN){
        start[i]=source[i];
        i++;
    }

    if(start[0] == '\xFE' && start[1] == '\xFF') {
        *signatureLength=2;
        return  "UTF-16BE";
    } else if(start[0] == '\xFF' && start[1] == '\xFE') {
        if(start[2] == '\x00' && start[3] =='\x00') {
            *signatureLength=4;
            return "UTF-32LE";
        } else {
            *signatureLength=2;
            return  "UTF-16LE";
        }
    } else if(start[0] == '\xEF' && start[1] == '\xBB' && start[2] == '\xBF') {
        *signatureLength=3;
        return  "UTF-8";
    } else if(start[0] == '\x00' && start[1] == '\x00' && 
              start[2] == '\xFE' && start[3]=='\xFF') {
        *signatureLength=4;
        return  "UTF-32BE";
    } else if(start[0] == '\x0E' && start[1] == '\xFE' && start[2] == '\xFF') {
        *signatureLength=3;
        return "SCSU";
    } else if(start[0] == '\xFB' && start[1] == '\xEE' && start[2] == '\x28') {
        *signatureLength=3;
        return "BOCU-1";
    } else if(start[0] == '\x2B' && start[1] == '\x2F' && start[2] == '\x76') {
        /*
         * UTF-7: Initial U+FEFF is encoded as +/v8  or  +/v9  or  +/v+  or  +/v/
         * depending on the second UTF-16 code unit.
         * Detect the entire, closed Unicode mode sequence +/v8- for only U+FEFF
         * if it occurs.
         *
         * So far we have +/v
         */
        if(start[3] == '\x38' && start[4] == '\x2D') {
            /* 5 bytes +/v8- */
            *signatureLength=5;
            return "UTF-7";
        } else if(start[3] == '\x38' || start[3] == '\x39' || start[3] == '\x2B' || start[3] == '\x2F') {
            /* 4 bytes +/v8  or  +/v9  or  +/v+  or  +/v/ */
            *signatureLength=4;
            return "UTF-7";
        }
    }else if(start[0]=='\xDD' && start[1]== '\x73'&& start[2]=='\x66' && start[3]=='\x73'){
        *signatureLength=4;
        return "UTF-EBCDIC";
    }


    /* no known Unicode signature byte sequence recognized */
    *signatureLength=0;
    return NULL;
}